

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

void __thiscall
helics::FederateInfo::loadInfoFromToml(FederateInfo *this,string *tomlString,bool runArgParser)

{
  pointer __s;
  undefined8 uVar1;
  string *psVar2;
  undefined8 this_00;
  void *pvVar3;
  basic_value<toml::type_config> *v;
  _Any_data *optionConversion;
  long lVar4;
  ifstream file;
  value doc;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  FederateInfo *local_358;
  string *local_350;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  undefined1 local_308 [16];
  code *local_2f8;
  code *local_2f0;
  undefined1 local_2c0 [104];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258 [14];
  basic_value<toml::type_config> local_f8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_f8);
  fileops::loadToml((value *)local_308,(string *)tomlString);
  v = (basic_value<toml::type_config> *)local_308;
  local_350 = tomlString;
  toml::basic_value<toml::type_config>::operator=(&local_f8,v);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_308,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_258);
  toml::detail::region::~region((region *)local_2c0);
  local_328._8_8_ = 0;
  local_310 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:974:68)>
              ::_M_invoke;
  local_318 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:974:68)>
              ::_M_manager;
  lVar4 = 0x18;
  local_358 = this;
  local_328._M_unused._M_object = this;
  do {
    if (*(int *)(propStringsTranslations + lVar4) < 0xc9) {
      local_308._0_8_ = &local_2f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_308,*(long *)((long)&PTR_what_004cd840 + lVar4),
                 *(long *)((long)&PTR__format_error_004cd838 + lVar4) +
                 *(long *)((long)&PTR_what_004cd840 + lVar4));
      fileops::callIfMember
                (&local_f8,(string *)local_308,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)&local_328);
      if ((code **)local_308._0_8_ != &local_2f8) {
        operator_delete((void *)local_308._0_8_,(long)local_2f8 + 1);
      }
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x690);
  optionConversion = (_Any_data *)local_308;
  local_308._0_8_ = (void *)0x0;
  local_308._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2f0 = CLI::std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:988:9)>
              ::_M_invoke;
  local_2f8 = CLI::std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:988:9)>
              ::_M_manager;
  local_378._M_unused._M_object = (App *)0x0;
  local_378._8_8_ = 0;
  local_360 = CLI::std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:989:9)>
              ::_M_invoke;
  local_368 = CLI::std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:989:9)>
              ::_M_manager;
  local_348._8_8_ = 0;
  local_348._M_unused._M_object = local_358;
  local_330 = CLI::std::
              _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:990:9)>
              ::_M_invoke;
  local_338 = CLI::std::
              _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:990:9)>
              ::_M_manager;
  processOptions(&local_f8,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)optionConversion,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_378,(function<void_(int,_int)> *)&local_348);
  psVar2 = local_350;
  if (local_338 != (code *)0x0) {
    optionConversion = &local_348;
    (*local_338)(optionConversion,optionConversion,3);
  }
  if (local_368 != (code *)0x0) {
    optionConversion = &local_378;
    (*local_368)(optionConversion,optionConversion,3);
  }
  if (local_2f8 != (code *)0x0) {
    optionConversion = (_Any_data *)local_308;
    (*local_2f8)(optionConversion,optionConversion,3);
  }
  if (!runArgParser) goto LAB_002430be;
  makeCLIApp((FederateInfo *)&local_378);
  local_378._M_unused._M_function_pointer[0x48] = (_func_void)0x1;
  CLI::App::get_config_formatter_base((App *)local_308);
  this_00 = local_308._8_8_;
  if ((_func_void *)local_308._0_8_ != (_func_void *)0x0) {
    *(code *)(local_308._0_8_ + 0x50) = (code)0x1;
  }
  if (psVar2->_M_string_length == 0) {
LAB_00242fd1:
    std::ifstream::ifstream(local_308,(string *)psVar2,_S_in);
    uVar1 = local_378._M_unused._0_8_;
    if (*(uint32_t *)(local_378._M_unused._M_function_pointer + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_378._M_unused._0_8_);
      CLI::App::_configure((App *)uVar1);
    }
    CLI::App::_parse_stream((App *)uVar1,(istream *)local_308);
    optionConversion = (_Any_data *)0x0;
    CLI::App::run_callback((App *)uVar1,false,false);
    std::ifstream::~ifstream(local_308);
  }
  else {
    __s = (psVar2->_M_dataplus)._M_p;
    pvVar3 = memchr(__s,0x3d,psVar2->_M_string_length);
    if ((long)pvVar3 - (long)__s == -1 || pvVar3 == (void *)0x0) goto LAB_00242fd1;
    std::__cxx11::istringstream::istringstream((istringstream *)local_308,(string *)psVar2,_S_in);
    uVar1 = local_378._M_unused._0_8_;
    if (*(uint32_t *)(local_378._M_unused._M_function_pointer + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_378._M_unused._0_8_);
      CLI::App::_configure((App *)uVar1);
    }
    CLI::App::_parse_stream((App *)uVar1,(istream *)local_308);
    CLI::App::run_callback((App *)uVar1,false,false);
    optionConversion = (_Any_data *)&std::__cxx11::istringstream::VTT;
    std::__cxx11::istringstream::~istringstream((istringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_2c0 + 0x30));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if ((App *)local_378._M_unused._0_8_ != (App *)0x0) {
    (**(code **)(*local_378._M_unused._M_object + 8))();
  }
LAB_002430be:
  if (local_318 != (code *)0x0) {
    optionConversion = (_Any_data *)&local_328;
    (*local_318)(optionConversion,optionConversion,3);
  }
  toml::basic_value<toml::type_config>::cleanup
            (&local_f8,(EVP_PKEY_CTX *)optionConversion->_M_pod_data);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8.comments_);
  toml::detail::region::~region(&local_f8.region_);
  return;
}

Assistant:

void FederateInfo::loadInfoFromToml(const std::string& tomlString, bool runArgParser)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }

    const std::function<void(const std::string&, Time)> timeCall = [this](const std::string& fname,
                                                                          Time arg) {
        setProperty(propStringsTranslations.at(fname), arg);
    };

    for (const auto& prop : propStringsTranslations) {
        if (prop.second > 200) {
            continue;
        }
        fileops::callIfMember(doc, std::string(prop.first.data(), prop.first.size()), timeCall);
    }

    processOptions(
        doc,
        [](const std::string& option) { return getFlagIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [this](int32_t option, int32_t value) { setFlagOption(option, value != 0); });

    if (runArgParser) {
        auto app = makeCLIApp();
        app->allow_extras();
        auto dptr = std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
        if (dptr) {
            dptr->skipJson(true);
        }
        try {
            if (tomlString.find('=') != std::string::npos) {
                std::istringstream tstring(tomlString);
                app->parse_from_stream(tstring);
            } else {
                std::ifstream file(tomlString);
                app->parse_from_stream(file);
            }
        }
        catch (const CLI::Error& e) {
            throw(InvalidIdentifier(e.what()));
        }
    }
}